

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::CountOuters(SQFuncState *this,SQInteger stacksize)

{
  SQLocalVarInfo *pSVar1;
  SQLocalVarInfo *lvi;
  SQInteger k;
  SQInteger outers;
  SQInteger stacksize_local;
  SQFuncState *this_local;
  
  k = 0;
  lvi = (SQLocalVarInfo *)sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  while (lvi = (SQLocalVarInfo *)((long)&lvi[-1]._pos + 7), stacksize <= (long)lvi) {
    pSVar1 = sqvector<SQLocalVarInfo>::operator[](&this->_vlocals,(SQUnsignedInteger)lvi);
    if (pSVar1->_end_op == 0xffffffffffffffff) {
      k = k + 1;
    }
  }
  return k;
}

Assistant:

SQInteger SQFuncState::CountOuters(SQInteger stacksize)
{
    SQInteger outers = 0;
    SQInteger k = _vlocals.size() - 1;
    while(k >= stacksize) {
        SQLocalVarInfo &lvi = _vlocals[k];
        k--;
        if(lvi._end_op == UINT_MINUS_ONE) { //this means is an outer
            outers++;
        }
    }
    return outers;
}